

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::matrix3d>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *result)

{
  pointer *ppmVar1;
  pointer pmVar2;
  StreamReader *pSVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  double *pdVar7;
  iterator iVar8;
  char cVar9;
  byte bVar10;
  char c;
  matrix3d value;
  string local_98;
  undefined1 local_78 [32];
  double local_58;
  double local_50;
  double dStack_48;
  double local_40;
  double local_38;
  
  bVar10 = 0;
  pmVar2 = (result->
           super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>).
      _M_impl.super__Vector_impl_data._M_finish != pmVar2) {
    (result->
    super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>).
    _M_impl.super__Vector_impl_data._M_finish = pmVar2;
  }
  bVar4 = SkipWhitespaceAndNewline(this,true);
  if (bVar4) {
    local_78._0_8_ = (pointer)0x3ff0000000000000;
    local_78._8_8_ = 0.0;
    local_78._16_8_ = 0.0;
    local_78._24_8_ = 0.0;
    local_58 = 1.0;
    local_50 = 0.0;
    dStack_48 = 0.0;
    local_40 = 0.0;
    local_38 = 1.0;
    bVar4 = ParseMatrix(this,(matrix3d *)local_78);
    if (bVar4) {
      iVar8._M_current =
           (result->
           super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>)
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>::
        _M_realloc_insert<tinyusdz::value::matrix3d_const&>
                  ((vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>> *)
                   result,iVar8,(matrix3d *)local_78);
      }
      else {
        pdVar7 = (double *)local_78;
        for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
          (iVar8._M_current)->m[0][0] = *pdVar7;
          pdVar7 = pdVar7 + (ulong)bVar10 * -2 + 1;
          iVar8._M_current = (matrix3d *)((long)iVar8._M_current + ((ulong)bVar10 * -2 + 1) * 8);
        }
        ppmVar1 = &(result->
                   super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppmVar1 = *ppmVar1 + 1;
      }
    }
    else {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Not starting with the value of requested type.\n","");
      PushError(this,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar4) {
      do {
        pSVar3 = this->_sr;
        if ((pSVar3->length_ <= pSVar3->idx_) || (pSVar3->binary_[pSVar3->idx_] == '\0'))
        goto LAB_0043c570;
        bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar4) {
          return false;
        }
        bVar4 = Char1(this,(char *)&local_98);
        cVar9 = '\x01';
        if (bVar4) {
          if ((char)local_98._M_dataplus._M_p == sep) {
            bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar4) {
              bVar4 = LookChar1(this,local_78);
              cVar9 = (local_78[0] == end_symbol) * '\x03';
              if (!bVar4) {
                cVar9 = '\x01';
              }
              if (local_78[0] != end_symbol && bVar4) goto LAB_0043c4a1;
            }
          }
          else {
LAB_0043c4a1:
            if ((char)local_98._M_dataplus._M_p == sep) {
              cVar9 = '\x01';
              bVar4 = SkipWhitespaceAndNewline(this,true);
              if (bVar4) {
                local_78._0_8_ = (pointer)0x3ff0000000000000;
                local_78._24_8_ = 0.0;
                local_78._8_8_ = 0.0;
                local_78._16_8_ = 0.0;
                local_58 = 1.0;
                local_40 = 0.0;
                local_50 = 0.0;
                dStack_48 = 0.0;
                local_38 = 1.0;
                bVar4 = ParseMatrix(this,(matrix3d *)local_78);
                cVar9 = '\x03';
                if (bVar4) {
                  iVar8._M_current =
                       (result->
                       super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar8._M_current ==
                      (result->
                      super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::
                    vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>::
                    _M_realloc_insert<tinyusdz::value::matrix3d_const&>
                              ((vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>
                                *)result,iVar8,(matrix3d *)local_78);
                  }
                  else {
                    pdVar7 = (double *)local_78;
                    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
                      (iVar8._M_current)->m[0][0] = *pdVar7;
                      pdVar7 = pdVar7 + (ulong)bVar10 * -2 + 1;
                      iVar8._M_current =
                           (matrix3d *)((long)iVar8._M_current + ((ulong)bVar10 * -2 + 1) * 8);
                    }
                    ppmVar1 = &(result->
                               super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppmVar1 = *ppmVar1 + 1;
                  }
                  cVar9 = '\0';
                }
              }
            }
            else {
              pSVar3 = this->_sr;
              cVar9 = '\x03';
              if ((0 < (long)pSVar3->idx_) && (uVar6 = pSVar3->idx_ - 1, uVar6 <= pSVar3->length_))
              {
                pSVar3->idx_ = uVar6;
              }
            }
          }
        }
      } while (cVar9 == '\0');
      if (cVar9 != '\x01') {
LAB_0043c570:
        if ((result->
            super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_78._0_8_ = local_78 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Empty array.\n","");
        PushError(this,(string *)local_78);
        if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}